

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processSimpleTypeDefinition
          (PSVIWriterHandlers *this,XSSimpleTypeDefinition *simpleType)

{
  short val;
  VARIETY variety;
  ulong uVar1;
  XMLCh *pXVar2;
  XSTypeDefinition *type;
  XSSimpleTypeDefinition *pXVar3;
  XSFacetList *facets;
  XSMultiValueFacetList *multiFacets;
  XSSimpleTypeDefinitionList *memberTypes;
  XSAnnotationList *annotations;
  XSSimpleTypeDefinition *simpleType_local;
  PSVIWriterHandlers *this_local;
  
  sendIndentedElementWithID
            (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSimpleTypeDefinition,(XSObject *)simpleType);
  uVar1 = (**(code **)(*(long *)simpleType + 0x38))();
  if ((uVar1 & 1) == 0) {
    pXVar2 = (XMLCh *)(**(code **)(*(long *)simpleType + 0x10))();
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgName,pXVar2);
  }
  else {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgName);
  }
  pXVar2 = (XMLCh *)(**(code **)(*(long *)simpleType + 0x18))();
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTargetNamespace,pXVar2);
  type = (XSTypeDefinition *)(**(code **)(*(long *)simpleType + 0x30))();
  processTypeDefinitionOrRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgBaseTypeDefinition,type);
  pXVar3 = xercesc_4_0::XSSimpleTypeDefinition::getPrimitiveType(simpleType);
  processTypeDefinitionOrRef
            (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrimitiveTypeDefinition,
             (XSTypeDefinition *)pXVar3);
  facets = xercesc_4_0::XSSimpleTypeDefinition::getFacets(simpleType);
  multiFacets = xercesc_4_0::XSSimpleTypeDefinition::getMultiValueFacets(simpleType);
  processFacets(this,facets,multiFacets);
  processFundamentalFacets(this,simpleType);
  val = xercesc_4_0::XSTypeDefinition::getFinal((XSTypeDefinition *)simpleType);
  pXVar2 = translateBlockOrFinal(this,val);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFinal,pXVar2);
  variety = xercesc_4_0::XSSimpleTypeDefinition::getVariety(simpleType);
  pXVar2 = translateSimpleTypeVariety(this,variety);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgVariety,pXVar2);
  pXVar3 = xercesc_4_0::XSSimpleTypeDefinition::getItemType(simpleType);
  processTypeDefinitionOrRef
            (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgItemTypeDefinition,(XSTypeDefinition *)pXVar3);
  memberTypes = xercesc_4_0::XSSimpleTypeDefinition::getMemberTypes(simpleType);
  processMemberTypeDefinitions(this,memberTypes);
  annotations = xercesc_4_0::XSSimpleTypeDefinition::getAnnotations(simpleType);
  processAnnotations(this,annotations);
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSimpleTypeDefinition);
  return;
}

Assistant:

void PSVIWriterHandlers::processSimpleTypeDefinition(XSSimpleTypeDefinition* simpleType) {
	sendIndentedElementWithID(PSVIUni::fgSimpleTypeDefinition, (XSObject*) simpleType);
	if (simpleType->getAnonymous())
		sendElementEmpty(PSVIUni::fgName);
	else sendElementValue(PSVIUni::fgName, simpleType->getName());
	sendElementValue(PSVIUni::fgTargetNamespace, simpleType->getNamespace());
	processTypeDefinitionOrRef(PSVIUni::fgBaseTypeDefinition, simpleType->getBaseType());
	processTypeDefinitionOrRef(PSVIUni::fgPrimitiveTypeDefinition, simpleType->getPrimitiveType());
	processFacets(simpleType->getFacets(), simpleType->getMultiValueFacets());
	processFundamentalFacets(simpleType);
	sendElementValue(PSVIUni::fgFinal, translateBlockOrFinal(simpleType->getFinal()));
	sendElementValue(PSVIUni::fgVariety, translateSimpleTypeVariety(simpleType->getVariety()));
	processTypeDefinitionOrRef(PSVIUni::fgItemTypeDefinition, simpleType->getItemType());
	processMemberTypeDefinitions(simpleType->getMemberTypes());
	processAnnotations(simpleType->getAnnotations());
	sendUnindentedElement(PSVIUni::fgSimpleTypeDefinition);
}